

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthCanonNN(uint uTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  undefined4 local_24;
  int i;
  int nMints;
  uint uPhase;
  uint uTruthC;
  uint uTruthMin;
  int nVars_local;
  uint uTruth_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uPhase = 0xffffffff;
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    uVar2 = Extra_TruthPolarize(uTruth,local_24,nVars);
    if (uVar2 < uPhase) {
      uPhase = uVar2;
    }
    uVar2 = Extra_TruthPolarize((uTruth ^ 0xffffffff) & 0xffffffffU >> (0x20U - (char)iVar1 & 0x1f),
                                local_24,nVars);
    if (uVar2 < uPhase) {
      uPhase = uVar2;
    }
  }
  return uPhase;
}

Assistant:

unsigned Extra_TruthCanonNN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uTruthC, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}